

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O3

void __thiscall Refal2::CScanner::processingLabel(CScanner *this,char c)

{
  if (((c != '_') && (0x19 < (byte)((c & 0xdfU) + 0xbf))) && (c != '-' && 9 < (byte)(c - 0x30U))) {
    if (c == '/') {
      (this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.token.
      type = TT_Label;
      CParser::AddToken(&this->super_CParser);
      this->state = S_Initial;
      return;
    }
    error(this,E_UnclosedLabel,c);
    this->state = S_Initial;
    processing(this,c);
    return;
  }
  std::__cxx11::string::push_back((char)this + -0x50);
  return;
}

Assistant:

void CScanner::processingLabel( char c )
{
	if( IsWordLetter( c ) ) {
		token.word += c;
	} else if( c == LimiterOfSymbol ) {
		addToken( TT_Label );
		state = S_Initial;
	} else {
		error( E_UnclosedLabel, c );
		state = S_Initial;
		processing( c );
	}
}